

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void simd::RgbToBgr(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                   uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  uint32_t rowSizeIn;
  uint32_t rowSizeOut;
  uint uVar1;
  uint uVar2;
  uint8_t *outY;
  SIMDType simdType_00;
  uint32_t nonSimdWidth;
  bool bVar4;
  uint local_8c;
  ulong local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  uint uVar3;
  
  local_88 = (ulong)height;
  simdType_00 = simdType;
  do {
    if (simdType_00 == cpu_function) break;
    uVar2 = getSimdSize(simdType_00);
    if (simdType_00 == neon_function) {
      uVar2 = 8;
    }
    if (uVar2 <= width * 3) {
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,startXIn,startYIn,out,startXOut,startYOut,width,(uint32_t)local_88);
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
      Image_Function::
      VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,&local_58);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
      local_8c = width * 3;
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,out);
      Image_Function::
      OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (&local_8c,&height,in,&local_80);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
      rowSizeIn = in->_rowSize;
      rowSizeOut = out->_rowSize;
      outY = out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * rowSizeOut);
      uVar1 = (uint)(byte)(((ushort)uVar2 & 0xff) % 3);
      uVar2 = uVar2 - uVar1;
      uVar3 = 0;
      if (local_8c % uVar2 < uVar1) {
        uVar3 = uVar2;
      }
      nonSimdWidth = uVar3 + local_8c % uVar2;
      if (simdType_00 != avx_function) {
        if (simdType_00 != sse_function) {
          return;
        }
        sse::RgbToBgr(outY,in->_data + (ulong)(startXIn * 3) + (ulong)(startYIn * rowSizeIn),
                      outY + height * rowSizeOut,rowSizeOut,rowSizeIn,'\x03',uVar2,
                      local_8c - nonSimdWidth,nonSimdWidth);
        return;
      }
      avx::RgbToBgr(outY,in->_data + (ulong)(startXIn * 3) + (ulong)(startYIn * rowSizeIn),
                    outY + height * rowSizeOut,rowSizeOut,rowSizeIn,'\x03',uVar2,
                    local_8c - nonSimdWidth,nonSimdWidth);
      return;
    }
    bVar4 = simdType_00 == avx_function;
    simdType_00 = sse_function;
  } while (bVar4);
  Image_Function::RgbToBgr(in,startXIn,startYIn,out,startXOut,startYOut,width,(uint32_t)local_88);
  return;
}

Assistant:

void RgbToBgr( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                   uint32_t width, uint32_t height, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );

        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;

        const uint8_t colorCount = RGB;

        if( (simdType == cpu_function) || ((width * colorCount) < simdSize) ) {
            AVX_CODE( RgbToBgr( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::RgbToBgr( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyRGBImage     ( in, out );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t rgbSimdSize = (simdSize / colorCount) * colorCount;
        const uint32_t simdWidth = width / rgbSimdSize;
        uint32_t totalSimdWidth = simdWidth * rgbSimdSize;
        uint32_t nonSimdWidth = width - totalSimdWidth;

        // to prevent unallowed access to memory
        if( nonSimdWidth < (simdSize % colorCount) ) {
            totalSimdWidth -= rgbSimdSize;
            nonSimdWidth += rgbSimdSize;
        }

        AVX_CODE( avx::RgbToBgr( outY, inY, outYEnd, rowSizeOut, rowSizeIn, colorCount, rgbSimdSize, totalSimdWidth, nonSimdWidth ); )
        SSSE3_CODE( sse::RgbToBgr( outY, inY, outYEnd, rowSizeOut, rowSizeIn, colorCount, rgbSimdSize, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::RgbToBgr( outY, inY, outYEnd, rowSizeOut, rowSizeIn, colorCount, rgbSimdSize, totalSimdWidth, nonSimdWidth ); )
    }